

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

void __thiscall
iu_Config_x_iutest_x_Check_Test::~iu_Config_x_iutest_x_Check_Test
          (iu_Config_x_iutest_x_Check_Test *this)

{
  iu_Config_x_iutest_x_Check_Test *this_local;
  
  ~iu_Config_x_iutest_x_Check_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(Config, Check)
{
#ifdef _MSC_FULL_VER
    SHOW_MACRO(_MSC_FULL_VER);
#endif
#ifdef _LIBCPP_VERSION
    SHOW_MACRO(_LIBCPP_VERSION);
#endif
#ifdef __GLIBCXX__
    SHOW_MACRO(__GLIBCXX__);
#endif
}